

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
                 *this,char *ptr,ParseContext *ctx)

{
  long *out;
  char *pcVar1;
  uint32_t *puVar2;
  size_type sVar3;
  ValueOnMemory *pVVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *pMVar13;
  double *pdVar14;
  int iVar15;
  double *local_50;
  pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<google::protobuf::MapPair<long,_double>_>,_bool>
  local_48;
  
  local_50 = (double *)ptr;
  bVar12 = EpsCopyInputStream::DoneWithCheck
                     (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  if ((bVar12) || (*(char *)local_50 != '\b')) {
    if (local_50 == (double *)0x0) {
      return (char *)0x0;
    }
    MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,google::protobuf::MessageLite,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1>
    ::
    Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1>,google::protobuf::Map<long,double>>
    ::_InternalParse(this);
    goto LAB_00215441;
  }
  out = &this->key_;
  local_50 = (double *)VarintParse<unsigned_long>((char *)((long)local_50 + 1),(unsigned_long *)out)
  ;
  if (local_50 == (double *)0x0) {
    return (char *)0x0;
  }
  bVar12 = EpsCopyInputStream::DoneWithCheck
                     (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  if ((bVar12) || (*(char *)local_50 != '\x11')) {
    if (local_50 == (double *)0x0) {
      return (char *)0x0;
    }
LAB_00215495:
    MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,google::protobuf::MessageLite,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1>
    ::
    Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1>,google::protobuf::Map<long,double>>
    ::_InternalParse(this);
  }
  else {
    sVar3 = (this->map_->elements_).num_elements_;
    Map<long,double>::InnerMap::insert<long_const&>(&local_48,this->map_,out);
    pdVar14 = (double *)&(local_48.first.node_)->field_0x8;
    this->value_ptr_ = pdVar14;
    if (sVar3 == (this->map_->elements_).num_elements_) {
      iVar15 = 0;
    }
    else {
      pcVar1 = (char *)((long)local_50 + 1);
      cVar5 = pcVar1[1];
      cVar6 = pcVar1[2];
      cVar7 = pcVar1[3];
      cVar8 = pcVar1[4];
      cVar9 = pcVar1[5];
      cVar10 = pcVar1[6];
      cVar11 = pcVar1[7];
      (local_48.first.node_)->field_0x8 = pcVar1[0];
      (local_48.first.node_)->field_0x9 = cVar5;
      (local_48.first.node_)->field_0xa = cVar6;
      (local_48.first.node_)->field_0xb = cVar7;
      (local_48.first.node_)->field_0xc = cVar8;
      (local_48.first.node_)->field_0xd = cVar9;
      (local_48.first.node_)->field_0xe = cVar10;
      (local_48.first.node_)->field_0xf = cVar11;
      local_50 = (double *)((long)local_50 + 9);
      bVar12 = EpsCopyInputStream::DoneWithCheck
                         (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
      iVar15 = 1;
      pdVar14 = local_50;
      if (!bVar12) {
        if (local_50 == (double *)0x0) {
          pdVar14 = (double *)0x0;
        }
        else {
          pMVar13 = (MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                     *)Arena::
                       CreateMaybeMessage<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse>
                                 ((this->mf_->map_).elements_.alloc_.arena_);
          this->entry_ = pMVar13;
          pVVar4 = this->value_ptr_;
          pMVar13->_has_bits_[0] = pMVar13->_has_bits_[0] | 2;
          pMVar13->value_ = *pVVar4;
          pdVar14 = (double *)Map<long,_double>::erase<long>(this->map_,out);
          iVar15 = 2;
        }
      }
    }
    if (iVar15 == 1) {
      return (char *)pdVar14;
    }
    if (iVar15 != 2) goto LAB_00215495;
  }
  pMVar13 = this->entry_;
  puVar2 = pMVar13->_has_bits_;
  *puVar2 = *puVar2 | 1;
  pMVar13->key_ = this->key_;
LAB_00215441:
  local_50 = (double *)
             MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
             ::_InternalParse(this->entry_,(char *)local_50,ctx);
  if (local_50 != (double *)0x0) {
    UseKeyAndValueFromEntry(this);
  }
  return (char *)local_50;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }